

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Bmc_MnaCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes,uint *pState)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = *(ulong *)pObj;
  if ((long)uVar3 < 0) {
    return;
  }
  *(ulong *)pObj = uVar3 | 0x8000000000000000;
  if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar3 < 0) {
    if (((uint)uVar3 & 0x9fffffff) != 0x9fffffff) {
LAB_0056971f:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcAnd.c"
                    ,0x9d,
                    "void Bmc_MnaCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, unsigned int *)"
                   );
    }
    uVar6 = (uint)(uVar3 >> 0x20);
    if ((int)(uVar6 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
      uVar7 = 3;
      if (p->vCis->nSize - p->nRegs <= (int)(uVar6 & 0x1fffffff)) goto LAB_0056971f;
    }
    else if (pState == (uint *)0x0) {
      uVar7 = 1;
    }
    else {
      iVar1 = p->vCis->nSize;
      if ((int)(uVar6 & 0x1fffffff) < iVar1 - p->nRegs) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar2 = p->vCos->nSize;
      uVar7 = (iVar2 - iVar1) + (uVar6 & 0x1fffffff);
      if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar7];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = *(undefined8 *)(p->pObjs + iVar1);
      if (-1 < (int)uVar4) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      uVar7 = *(uint *)((long)pState + (ulong)(((uint)((ulong)uVar4 >> 0x20) & 0x1ffffff0) >> 2)) >>
              ((char)((ulong)uVar4 >> 0x20) * '\x02' & 0x1fU) & 3;
    }
  }
  else {
    Bmc_MnaCollect_rec(p,pObj + -(uVar3 & 0x1fffffff),vNodes,pState);
    Bmc_MnaCollect_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes,pState);
    uVar3 = *(ulong *)pObj;
    uVar7 = (pObj[-(uVar3 >> 0x20 & 0x1fffffff)].Value == 3 ||
            pObj[-(uVar3 & 0x1fffffff)].Value == 3) | 2;
    if (((uint)(uVar3 >> 0x3d) & 1) + 1 == pObj[-(uVar3 >> 0x20 & 0x1fffffff)].Value) {
      uVar7 = 1;
    }
    if ((((uint)uVar3 >> 0x1d & 1) != 0) + 1 == pObj[-(uVar3 & 0x1fffffff)].Value) {
      uVar7 = 1;
    }
  }
  pObj->Value = uVar7;
  pGVar5 = p->pObjs;
  if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
    Vec_IntPush(vNodes,(int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555);
    return;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Bmc_MnaCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes, unsigned * pState )
{
    if ( pObj->fPhase )
        return;
    pObj->fPhase = 1;
    if ( Gia_ObjIsAnd(pObj) )
    {
        Bmc_MnaCollect_rec( p, Gia_ObjFanin0(pObj), vNodes, pState );
        Bmc_MnaCollect_rec( p, Gia_ObjFanin1(pObj), vNodes, pState );
        pObj->Value = Gia_XsimAndCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC1(pObj) );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        pObj->Value = pState ? Gia_ManTerSimInfoGet( pState, Gia_ObjCioId(Gia_ObjRoToRi(p, pObj)) ) : GIA_ZER;
    else if ( Gia_ObjIsPi(p, pObj) )
        pObj->Value = GIA_UND;
    else assert( 0 );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}